

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O0

int __thiscall
zmq::ip_resolver_t::resolve_getaddrinfo(ip_resolver_t *this,ip_addr_t *ip_addr_,char *addr_)

{
  bool bVar1;
  int *piVar2;
  undefined8 in_RDX;
  void *in_RSI;
  long *in_RDI;
  int rc;
  addrinfo req;
  addrinfo *res;
  int local_5c;
  uint local_58;
  int local_54;
  undefined4 local_50;
  long local_28;
  undefined8 local_20;
  void *local_18;
  int local_4;
  
  local_28 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memset(&local_58,0,0x30);
  bVar1 = ip_resolver_options_t::ipv6((ip_resolver_options_t *)(in_RDI + 1));
  local_54 = 2;
  if (bVar1) {
    local_54 = 10;
  }
  local_50 = 1;
  local_58 = 0;
  bVar1 = ip_resolver_options_t::bindable((ip_resolver_options_t *)(in_RDI + 1));
  if (bVar1) {
    local_58 = local_58 | 1;
  }
  bVar1 = ip_resolver_options_t::allow_dns((ip_resolver_options_t *)(in_RDI + 1));
  if (!bVar1) {
    local_58 = local_58 | 4;
  }
  if (local_54 == 10) {
    local_58 = local_58 | 8;
  }
  local_5c = (**(code **)(*in_RDI + 0x10))(in_RDI,local_20,0,&local_58,&local_28);
  if ((local_5c == -1) && ((local_58 & 8) != 0)) {
    local_58 = local_58 & 0xfffffff7;
    local_5c = (**(code **)(*in_RDI + 0x10))(in_RDI,local_20,0,&local_58,&local_28);
  }
  if (local_5c == 0) {
    if (local_28 == 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","res != NULL",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip_resolver.cpp"
              ,0x18a);
      fflush(_stderr);
      zmq_abort((char *)0x2f1318);
    }
    if (0x1c < *(uint *)(local_28 + 0x10)) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "static_cast<size_t> (res->ai_addrlen) <= sizeof (*ip_addr_)",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip_resolver.cpp"
              ,0x18b);
      fflush(_stderr);
      zmq_abort((char *)0x2f137a);
    }
    memcpy(local_18,*(void **)(local_28 + 0x18),(ulong)*(uint *)(local_28 + 0x10));
    (**(code **)(*in_RDI + 0x18))(in_RDI,local_28);
    local_4 = 0;
  }
  else {
    if (local_5c == -10) {
      piVar2 = __errno_location();
      *piVar2 = 0xc;
    }
    else {
      bVar1 = ip_resolver_options_t::bindable((ip_resolver_options_t *)(in_RDI + 1));
      if (bVar1) {
        piVar2 = __errno_location();
        *piVar2 = 0x13;
      }
      else {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
      }
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int zmq::ip_resolver_t::resolve_getaddrinfo (ip_addr_t *ip_addr_,
                                             const char *addr_)
{
#if defined ZMQ_HAVE_OPENVMS && defined __ia64
    __addrinfo64 *res = NULL;
    __addrinfo64 req;
#else
    addrinfo *res = NULL;
    addrinfo req;
#endif

    memset (&req, 0, sizeof (req));

    //  Choose IPv4 or IPv6 protocol family. Note that IPv6 allows for
    //  IPv4-in-IPv6 addresses.
    req.ai_family = _options.ipv6 () ? AF_INET6 : AF_INET;

    //  Arbitrary, not used in the output, but avoids duplicate results.
    req.ai_socktype = SOCK_STREAM;

    req.ai_flags = 0;

    if (_options.bindable ()) {
        req.ai_flags |= AI_PASSIVE;
    }

    if (!_options.allow_dns ()) {
        req.ai_flags |= AI_NUMERICHOST;
    }

#if defined AI_V4MAPPED
    //  In this API we only require IPv4-mapped addresses when
    //  no native IPv6 interfaces are available (~AI_ALL).
    //  This saves an additional DNS roundtrip for IPv4 addresses.
    if (req.ai_family == AF_INET6) {
        req.ai_flags |= AI_V4MAPPED;
    }
#endif

    //  Resolve the literal address. Some of the error info is lost in case
    //  of error, however, there's no way to report EAI errors via errno.
    int rc = do_getaddrinfo (addr_, NULL, &req, &res);

#if defined AI_V4MAPPED
    // Some OS do have AI_V4MAPPED defined but it is not supported in getaddrinfo()
    // returning EAI_BADFLAGS. Detect this and retry
    if (rc == EAI_BADFLAGS && (req.ai_flags & AI_V4MAPPED)) {
        req.ai_flags &= ~AI_V4MAPPED;
        rc = do_getaddrinfo (addr_, NULL, &req, &res);
    }
#endif

#if defined ZMQ_HAVE_WINDOWS
    //  Resolve specific case on Windows platform when using IPv4 address
    //  with ZMQ_IPv6 socket option.
    if ((req.ai_family == AF_INET6) && (rc == WSAHOST_NOT_FOUND)) {
        req.ai_family = AF_INET;
        rc = do_getaddrinfo (addr_, NULL, &req, &res);
    }
#endif

    if (rc) {
        switch (rc) {
            case EAI_MEMORY:
                errno = ENOMEM;
                break;
            default:
                if (_options.bindable ()) {
                    errno = ENODEV;
                } else {
                    errno = EINVAL;
                }
                break;
        }
        return -1;
    }

    //  Use the first result.
    zmq_assert (res != NULL);
    zmq_assert (static_cast<size_t> (res->ai_addrlen) <= sizeof (*ip_addr_));
    memcpy (ip_addr_, res->ai_addr, res->ai_addrlen);

    //  Cleanup getaddrinfo after copying the possibly referenced result.
    do_freeaddrinfo (res);

    return 0;
}